

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O2

Matrix * __thiscall
ConditionalEstimator::getEstimate
          (Matrix *__return_storage_ptr__,ConditionalEstimator *this,Property *p)

{
  double dVar1;
  uint uVar2;
  StochasticProcess *pSVar3;
  uint uVar4;
  ostream *poVar5;
  int i;
  int iVar6;
  int i_00;
  long lVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  double local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  double local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  double local_6c8;
  Matrix local_6c0;
  Graph a;
  Matrix local_4c0;
  Physical local_3c0;
  Physical local_328;
  Physical local_290;
  Physical local_1f8;
  Physical local_160;
  Physical local_c8;
  
  uVar4 = (this->super_Estimator).nEstimate;
  uVar2 = (this->super_Estimator).nSamples;
  if (uVar2 == 0) {
    local_758 = 1.0;
  }
  else {
    local_758 = (double)uVar2;
  }
  if ((uVar4 & 0x40) != 0) {
    std::operator<<((ostream *)&std::cout,"multiplying by dt: ");
    poVar5 = std::ostream::_M_insert<double>(((this->super_Estimator).estimatorTime)->dt);
    std::endl<char,std::char_traits<char>>(poVar5);
    local_758 = local_758 * ((this->super_Estimator).estimatorTime)->dt;
    uVar4 = (this->super_Estimator).nEstimate;
  }
  uVar4 = uVar4 & *p;
  if ((uVar4 & 1) == 0) {
    if ((uVar4 & 4) == 0) {
      if ((uVar4 & 0x20) == 0) {
        if ((uVar4 & 8) == 0) {
          if ((uVar4 & 2) != 0) {
            local_6f0 = (double)((long)this->nPost + (long)this->nPre);
            Matrix::Matrix(__return_storage_ptr__,SUB84(local_6f0,0) + 1,this->nDist,3);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&a,"conditional density",(allocator<char> *)&local_6c0);
            Matrix::setName(__return_storage_ptr__,(string *)&a);
            std::__cxx11::string::~string((string *)&a);
            pSVar3 = (this->super_Estimator).pSource;
            if (pSVar3 != (StochasticProcess *)0x0) {
              std::__cxx11::string::string
                        ((string *)&local_730,(string *)&(pSVar3->super_Parametric).parametricName);
              std::operator+(&local_710,"conditional density of ",&local_730);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_4c0,&local_710," (");
              std::__cxx11::string::string
                        ((string *)&local_750,
                         (string *)
                         &(((this->super_Estimator).pSource)->super_Parametric).parametricType);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_6c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_4c0,&local_750);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_6c0,")");
              Matrix::setName(__return_storage_ptr__,(string *)&a);
              std::__cxx11::string::~string((string *)&a);
              std::__cxx11::string::~string((string *)&local_6c0);
              std::__cxx11::string::~string((string *)&local_750);
              std::__cxx11::string::~string((string *)&local_4c0);
              std::__cxx11::string::~string((string *)&local_710);
              std::__cxx11::string::~string((string *)&local_730);
            }
            for (lVar9 = 0; lVar9 < this->nDist; lVar9 = lVar9 + 1) {
              iVar8 = (int)lVar9;
              local_6c8 = (double)iVar8;
              for (lVar7 = 0; lVar7 <= (long)local_6f0; lVar7 = lVar7 + 1) {
                i_00 = (int)lVar7;
                iVar6 = this->nPre;
                dVar1 = ((this->super_Estimator).estimatorTime)->dt;
                Matrix::operator[](&local_4c0,__return_storage_ptr__,i_00);
                Matrix::operator[](&local_6c0,&local_4c0,iVar8);
                Matrix::operator[](&a.super_Matrix,&local_6c0,0);
                Matrix::operator=(&a.super_Matrix,((double)i_00 - (double)iVar6) * dVar1);
                Matrix::~Matrix(&a.super_Matrix);
                Matrix::~Matrix(&local_6c0);
                Matrix::~Matrix(&local_4c0);
                dVar10 = this->dDistScale * local_6c8;
                dVar1 = this->dDistOffset;
                Matrix::operator[](&local_4c0,__return_storage_ptr__,i_00);
                Matrix::operator[](&local_6c0,&local_4c0,iVar8);
                Matrix::operator[](&a.super_Matrix,&local_6c0,1);
                Matrix::operator=(&a.super_Matrix,dVar10 + dVar1);
                Matrix::~Matrix(&a.super_Matrix);
                Matrix::~Matrix(&local_6c0);
                Matrix::~Matrix(&local_4c0);
                dVar1 = this->aDist[lVar7][lVar9];
                Matrix::operator[](&local_4c0,__return_storage_ptr__,i_00);
                Matrix::operator[](&local_6c0,&local_4c0,iVar8);
                Matrix::operator[](&a.super_Matrix,&local_6c0,2);
                Matrix::operator=(&a.super_Matrix,dVar1 / local_758);
                Matrix::~Matrix(&a.super_Matrix);
                Matrix::~Matrix(&local_6c0);
                Matrix::~Matrix(&local_4c0);
              }
            }
            return __return_storage_ptr__;
          }
          Matrix::Matrix(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        Graph::Graph(&a,this->nPre + this->nPost + 1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"conditional variance",(allocator<char> *)&local_4c0);
        Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        pSVar3 = (this->super_Estimator).pSource;
        if (pSVar3 != (StochasticProcess *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_750,(string *)&(pSVar3->super_Parametric).parametricName);
          std::operator+(&local_730,"conditional variance of ",&local_750);
          std::operator+(&local_710,&local_730," (");
          std::__cxx11::string::string
                    ((string *)&local_6e8,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4c0,&local_710,&local_6e8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_6c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4c0,")");
          Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&local_750);
        }
        for (lVar9 = 0; iVar8 = this->nPre, lVar9 <= (long)this->nPost + (long)iVar8;
            lVar9 = lVar9 + 1) {
          iVar6 = (int)lVar9;
          dVar1 = ((this->super_Estimator).estimatorTime)->dt;
          Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
          Matrix::operator[](&local_6c0,&local_4c0,0);
          Matrix::operator=(&local_6c0,((double)iVar6 - (double)iVar8) * dVar1);
          Matrix::~Matrix(&local_6c0);
          Matrix::~Matrix(&local_4c0);
          local_6f0 = this->aOne[lVar9];
          dVar1 = this->aTwo[lVar9];
          Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
          Matrix::operator[](&local_6c0,&local_4c0,1);
          Matrix::operator=(&local_6c0,
                            dVar1 / local_758 - (local_6f0 / local_758) * (local_6f0 / local_758));
          Matrix::~Matrix(&local_6c0);
          Matrix::~Matrix(&local_4c0);
        }
        Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
      }
      else {
        Graph::Graph(&a,this->nPre + this->nPost + 1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"conditional auto-correlation",(allocator<char> *)&local_4c0
                  );
        Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        pSVar3 = (this->super_Estimator).pSource;
        if (pSVar3 != (StochasticProcess *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_750,(string *)&(pSVar3->super_Parametric).parametricName);
          std::operator+(&local_730,"conditional auto-correlation of ",&local_750);
          std::operator+(&local_710,&local_730," (");
          std::__cxx11::string::string
                    ((string *)&local_6e8,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4c0,&local_710,&local_6e8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_6c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4c0,")");
          Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&local_750);
        }
        for (lVar9 = 0; iVar8 = this->nPre, lVar9 <= (long)this->nPost + (long)iVar8;
            lVar9 = lVar9 + 1) {
          iVar6 = (int)lVar9;
          dVar1 = ((this->super_Estimator).estimatorTime)->dt;
          Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
          Matrix::operator[](&local_6c0,&local_4c0,0);
          Matrix::operator=(&local_6c0,(((double)iVar6 - (double)iVar8) + 1.0) * dVar1);
          Matrix::~Matrix(&local_6c0);
          Matrix::~Matrix(&local_4c0);
          dVar1 = this->aEvents[lVar9];
          Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
          Matrix::operator[](&local_6c0,&local_4c0,1);
          Matrix::operator=(&local_6c0,dVar1 / local_758);
          Matrix::~Matrix(&local_6c0);
          Matrix::~Matrix(&local_4c0);
        }
        Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
      }
    }
    else {
      Graph::Graph(&a,this->nPre + this->nPost + 1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0,"conditional mean",(allocator<char> *)&local_4c0);
      Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6c0);
      pSVar3 = (this->super_Estimator).pSource;
      if (pSVar3 != (StochasticProcess *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_750,(string *)&(pSVar3->super_Parametric).parametricName);
        std::operator+(&local_730,"conditional mean of ",&local_750);
        std::operator+(&local_710,&local_730," (");
        std::__cxx11::string::string
                  ((string *)&local_6e8,
                   (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4c0,&local_710,&local_6e8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_6c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4c0,")");
        Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::__cxx11::string::~string((string *)&local_710);
        std::__cxx11::string::~string((string *)&local_730);
        std::__cxx11::string::~string((string *)&local_750);
        Physical::Physical(&local_290,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(&a.super_Matrix,&local_290);
        Physical::~Physical(&local_290);
        Physical::Physical(&local_328,&((this->super_Estimator).estimatorTime)->super_Physical);
        Matrix::setPhysical(&a.super_Matrix,0,&local_328);
        Physical::~Physical(&local_328);
        Physical::Physical(&local_3c0,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical(&a.super_Matrix,1,&local_3c0);
        Physical::~Physical(&local_3c0);
      }
      for (lVar9 = 0; iVar8 = this->nPre, lVar9 <= (long)this->nPost + (long)iVar8;
          lVar9 = lVar9 + 1) {
        iVar6 = (int)lVar9;
        dVar1 = ((this->super_Estimator).estimatorTime)->dt;
        Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
        Matrix::operator[](&local_6c0,&local_4c0,0);
        Matrix::operator=(&local_6c0,((double)iVar6 - (double)iVar8) * dVar1);
        Matrix::~Matrix(&local_6c0);
        Matrix::~Matrix(&local_4c0);
        dVar1 = this->aOne[lVar9];
        Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
        Matrix::operator[](&local_6c0,&local_4c0,1);
        Matrix::operator=(&local_6c0,dVar1 / local_758);
        Matrix::~Matrix(&local_6c0);
        Matrix::~Matrix(&local_4c0);
      }
      Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
    }
  }
  else {
    Graph::Graph(&a,this->nPre + this->nPost + 1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"sample",(allocator<char> *)&local_4c0);
    Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    pSVar3 = (this->super_Estimator).pSource;
    if (pSVar3 != (StochasticProcess *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_750,(string *)&(pSVar3->super_Parametric).parametricName);
      std::operator+(&local_730,"conditional sample of ",&local_750);
      std::operator+(&local_710,&local_730," (");
      std::__cxx11::string::string
                ((string *)&local_6e8,
                 (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c0
                     ,&local_710,&local_6e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_4c0,")");
      Matrix::setName(&a.super_Matrix,(string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_6e8);
      std::__cxx11::string::~string((string *)&local_710);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
      Physical::Physical(&local_c8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(&a.super_Matrix,&local_c8);
      Physical::~Physical(&local_c8);
      Physical::Physical(&local_160,&((this->super_Estimator).estimatorTime)->super_Physical);
      Matrix::setPhysical(&a.super_Matrix,0,&local_160);
      Physical::~Physical(&local_160);
      Physical::Physical(&local_1f8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical(&a.super_Matrix,1,&local_1f8);
      Physical::~Physical(&local_1f8);
    }
    for (lVar9 = 0; iVar8 = this->nPre, lVar9 <= (long)this->nPost + (long)iVar8; lVar9 = lVar9 + 1)
    {
      iVar6 = (int)lVar9;
      dVar1 = ((this->super_Estimator).estimatorTime)->dt;
      Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
      Matrix::operator[](&local_6c0,&local_4c0,0);
      Matrix::operator=(&local_6c0,((double)iVar6 - (double)iVar8) * dVar1);
      Matrix::~Matrix(&local_6c0);
      Matrix::~Matrix(&local_4c0);
      dVar1 = this->condSamples[lVar9];
      Matrix::operator[](&local_4c0,&a.super_Matrix,iVar6);
      Matrix::operator[](&local_6c0,&local_4c0,1);
      Matrix::operator=(&local_6c0,dVar1);
      Matrix::~Matrix(&local_6c0);
      Matrix::~Matrix(&local_4c0);
    }
    Matrix::Matrix(__return_storage_ptr__,&a.super_Matrix);
  }
  Matrix::~Matrix(&a.super_Matrix);
  return __return_storage_ptr__;
}

Assistant:

Matrix ConditionalEstimator::getEstimate(const Property& p)
{
	double samples = (nSamples!=0.0)? double(nSamples): 1.0;
	if(nEstimate & EST_DIFF) {
		cout << "multiplying by dt: " << estimatorTime->dt << endl;
		samples *= estimatorTime->dt;
	}
	if(p & nEstimate & EST_SAMPLE) {
		Graph a(nPre+nPost+1);
		a.setName("sample");
		if( pSource ) {
			a.setName( "conditional sample of " + pSource->getName() + " (" + pSource->getType() + ")");
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			a[i][1] = condSamples[i];
		}
		return a;
	}		
	if(p & nEstimate & EST_MEAN) {
		Graph a(nPre+nPost+1);
		a.setName("conditional mean");
		if( pSource ) {
			a.setName( "conditional mean of " + pSource->getName() + " (" + pSource->getType() + ")");
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			a[i][1] = aOne[i] / samples;
		}
		return a;
	}
	if(p & nEstimate & EST_EVENTS) {
		Graph a(nPre+nPost+1);
		a.setName("conditional auto-correlation");
		if (pSource)
			a.setName("conditional auto-correlation of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre + 1);
			a[i][1] = aEvents[i] / samples;
		}
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Graph a(nPre+nPost+1);
		a.setName("conditional variance");
		if (pSource)
			a.setName("conditional variance of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			double mean = aOne[i] / samples;
			a[i][1] = (aTwo[i] / samples - mean*mean);
		}
		return a;
	}
	else if( p & nEstimate & EST_DENS ) {
		int timeSize = nPre+nPost+1;
		Matrix a(timeSize, nDist, 3);
		a.setName("conditional density");
		if (pSource)
			a.setName("conditional density of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int j=0; j<nDist; j++)
			for( int i=0; i<timeSize; i++ ) {
				a[i][j][0] = estimatorTime->dt * ((double) i - nPre);
				a[i][j][1] = (double(j) * dDistScale) + dDistOffset;
				a[i][j][2] = aDist[i][j] / samples;
			}
		return a;
	}
	return Matrix();
}